

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O0

ostream * MinVR::operator<<(ostream *os,VRDatumPtr *p)

{
  VRDatum *pVVar1;
  ostream *poVar2;
  VRDatumPtr *in_RSI;
  ostream *in_RDI;
  string local_30 [48];
  
  pVVar1 = VRDatumPtr::operator->(in_RSI);
  (*pVVar1->_vptr_VRDatum[2])();
  poVar2 = std::operator<<(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return poVar2;
}

Assistant:

std::ostream & operator<<(std::ostream &os, VRDatumPtr& p) {
  return os << p->getValueString();
}